

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall
skiwi::anon_unknown_23::bug_from_jaffer_test::~bug_from_jaffer_test(bug_from_jaffer_test *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      build_apply();
      build_callcc();
      build_r5rs();

      TEST_EQ("#t", run("(define (get2) (let ((a 2)) a)) (define num? (lambda (x) (fixnum? x))) (num? (apply get2 '()))"));
      for (int i = 0; i < 10; ++i)
        TEST_EQ("#t", run("(string? (apply string-append1 (list \"foo\" \"bar\")))"));
      TEST_EQ("1", run("'#\\  1"));
      TEST_EQ("#\\ ", run("'#\\  #\\space"));

      TEST_EQ("#f", run("(equal? \"martin\" (symbol->string 'Martin))"));
      TEST_EQ("#f", run("(equal? \"martin\" \"Martin\")"));
      TEST_EQ("a", run("(quote a)"));
      TEST_EQ("(quote a)", run("(quote 'a)"));

      TEST_EQ("(a b c)", run("(quote (a b c))"));
      TEST_EQ("(a b c . d)", run("(quote (a b c . d))"));

      TEST_EQ("<lambda>", run("(define list-length (lambda(obj) (%call/cc (lambda(return) (letrec((r(lambda(obj) (cond((null? obj) 0) ((pair? obj) (+ (r (cdr obj)) 1)) (else (return #f)))))) (r obj))))))"));
      TEST_EQ("4", run("(list-length '(1 2 3 4))"));
      TEST_EQ("#f", run("(list-length '(a b . c))"));
      TEST_EQ("#f", run("(apply list-length (list '(a b . c)))"));

      TEST_EQ("#t", run("(eqv? #\\  #\\space)"));
      TEST_EQ("#t", run("(eqv? '#\\  #\\space)"));
      TEST_EQ("\"a\"", run("(substring \"ab\" 0 1)"));
#ifdef _WIN32      
      TEST_EQ("(1 2 3 4 5)", run("(include \"data\\\\include_test_4.scm\") (test)"));
#else
      TEST_EQ("(1 2 3 4 5)", run("(include \"./data/include_test_4_linux.scm\") (test)"));
#endif      
      }